

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_contentTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  uint uVar9;
  uint *puVar11;
  long lVar12;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  char *extraout_RDX_17;
  char *extraout_RDX_18;
  char *extraout_RDX_19;
  int iVar13;
  unsigned_short *in_R8;
  char *pcVar14;
  char **ppcVar15;
  uint uVar10;
  
  if (ptr == end) {
    return -4;
  }
  puVar11 = &switchD_004ca392::switchdataD_005bfd48;
  pcVar8 = end;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 0:
  case 1:
  case 8:
    break;
  case 2:
    ppcVar15 = (char **)(ptr + 1);
    if (ppcVar15 == (char **)end) {
      return -1;
    }
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar15)) {
    case 5:
      if ((long)end - (long)ppcVar15 < 2) {
        return -2;
      }
      iVar6 = (**(code **)&enc[2].minBytesPerChar)(enc,ppcVar15);
      lVar12 = 2;
      pcVar8 = extraout_RDX_07;
      break;
    case 6:
      if ((long)(end + -(long)ppcVar15) < 3) {
        return -2;
      }
      iVar6 = (*enc[3].scanners[0])(enc,(char *)ppcVar15,end,(char **)(end + -(long)ppcVar15));
      lVar12 = 3;
      pcVar8 = extraout_RDX_06;
      break;
    case 7:
      if ((long)(end + -(long)ppcVar15) < 4) {
        return -2;
      }
      iVar6 = (*enc[3].scanners[1])(enc,(char *)ppcVar15,end,(char **)(end + -(long)ppcVar15));
      lVar12 = 4;
      pcVar8 = extraout_RDX_05;
      break;
    default:
      goto switchD_004ca50a_caseD_8;
    case 0xf:
      iVar6 = normal_scanPi(enc,ptr + 2,end,nextTokPtr);
      return iVar6;
    case 0x10:
      pbVar1 = (byte *)(ptr + 2);
      if (pbVar1 == (byte *)end) {
        return -1;
      }
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)*pbVar1);
      if (cVar2 != '\x14') {
        if (cVar2 != '\x1b') {
          *nextTokPtr = (char *)pbVar1;
          return 0;
        }
        iVar6 = normal_scanComment(enc,ptr + 3,end,nextTokPtr);
        return iVar6;
      }
      pcVar8 = ptr + 3;
      if ((long)end - (long)pcVar8 < 6) {
        return -1;
      }
      pcVar14 = ptr + 9;
      lVar12 = 0;
      do {
        if (pcVar8[lVar12] != (&big2_scanCdataSection_CDATA_LSQB)[lVar12]) {
          pcVar14 = pcVar8 + lVar12;
          iVar6 = 0;
          goto LAB_004cab94;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 6);
      iVar6 = 8;
LAB_004cab94:
      *nextTokPtr = pcVar14;
      return iVar6;
    case 0x11:
      ppcVar15 = (char **)(ptr + 2);
      if (ppcVar15 == (char **)end) {
        return -1;
      }
      bVar3 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar15);
      iVar6 = 0;
      iVar13 = 0;
      if (bVar3 < 7) {
        if (bVar3 == 5) {
          if ((long)end - (long)ppcVar15 < 2) {
            return -2;
          }
          iVar7 = (**(code **)&enc[2].minBytesPerChar)(enc,ppcVar15);
          lVar12 = 2;
          pcVar8 = extraout_RDX_16;
        }
        else {
          iVar6 = iVar13;
          if (bVar3 != 6) goto switchD_004caa8f_caseD_8;
          if ((long)(end + -(long)ppcVar15) < 3) {
            return -2;
          }
          iVar7 = (*enc[3].scanners[0])(enc,(char *)ppcVar15,end,(char **)(end + -(long)ppcVar15));
          lVar12 = 3;
          pcVar8 = extraout_RDX_14;
        }
LAB_004caa4d:
        iVar6 = iVar13;
        if (iVar7 == 0) goto switchD_004caa8f_caseD_8;
      }
      else {
        if (bVar3 == 7) {
          if ((long)(end + -(long)ppcVar15) < 4) {
            return -2;
          }
          iVar7 = (*enc[3].scanners[1])(enc,(char *)ppcVar15,end,(char **)(end + -(long)ppcVar15));
          lVar12 = 4;
          pcVar8 = extraout_RDX_15;
          goto LAB_004caa4d;
        }
        lVar12 = 1;
        if ((bVar3 != 0x16) && (bVar3 != 0x18)) goto switchD_004caa8f_caseD_8;
      }
      ppcVar15 = (char **)((long)ppcVar15 + lVar12);
      while( true ) {
        if (ppcVar15 == (char **)end) {
          return -1;
        }
        lVar12 = 1;
        iVar6 = iVar13;
        switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar15)) {
        case 5:
          if ((long)end - (long)ppcVar15 < 2) {
            return -2;
          }
          iVar7 = (*enc[2].isPublicId)(enc,(char *)ppcVar15,pcVar8,(char **)0x1);
          lVar12 = 2;
          pcVar8 = extraout_RDX_17;
          break;
        case 6:
          if ((long)end - (long)ppcVar15 < 3) {
            return -2;
          }
          iVar7 = (*enc[2].utf8Convert)(enc,ppcVar15,pcVar8,(char **)0x1,(char *)in_R8);
          lVar12 = 3;
          pcVar8 = extraout_RDX_19;
          break;
        case 7:
          if ((long)end - (long)ppcVar15 < 4) {
            return -2;
          }
          iVar7 = (*enc[2].utf16Convert)(enc,ppcVar15,pcVar8,(unsigned_short **)0x1,in_R8);
          lVar12 = 4;
          pcVar8 = extraout_RDX_18;
          break;
        default:
          goto switchD_004caa8f_caseD_8;
        case 9:
        case 10:
        case 0x15:
          goto switchD_004caa8f_caseD_9;
        case 0xb:
          goto switchD_004caa8f_caseD_b;
        case 0x16:
        case 0x17:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
          goto switchD_004caa8f_caseD_16;
        }
        if (iVar7 == 0) break;
switchD_004caa8f_caseD_16:
        ppcVar15 = (char **)((long)ppcVar15 + lVar12);
      }
switchD_004caa8f_caseD_8:
      *nextTokPtr = (char *)ppcVar15;
      return iVar6;
    case 0x16:
    case 0x18:
      lVar12 = 1;
      goto LAB_004ca69f;
    }
    if (iVar6 == 0) {
switchD_004ca50a_caseD_8:
      *nextTokPtr = (char *)ppcVar15;
      return 0;
    }
LAB_004ca69f:
    ppcVar15 = (char **)((long)ppcVar15 + lVar12);
    if (ppcVar15 == (char **)end) {
      return -1;
    }
    bVar4 = false;
LAB_004ca6ba:
    lVar12 = 1;
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar15)) {
    case 5:
      if ((long)end - (long)ppcVar15 < 2) {
        return -2;
      }
      iVar6 = (*enc[2].isPublicId)(enc,(char *)ppcVar15,pcVar8,(char **)0x1);
      lVar12 = 2;
      pcVar8 = extraout_RDX_08;
      break;
    case 6:
      if ((long)end - (long)ppcVar15 < 3) {
        return -2;
      }
      iVar6 = (*enc[2].utf8Convert)(enc,ppcVar15,pcVar8,(char **)0x1,(char *)in_R8);
      lVar12 = 3;
      pcVar8 = extraout_RDX_09;
      break;
    case 7:
      if ((long)end - (long)ppcVar15 < 4) {
        return -2;
      }
      iVar6 = (*enc[2].utf16Convert)(enc,ppcVar15,pcVar8,(unsigned_short **)0x1,in_R8);
      lVar12 = 4;
      pcVar8 = extraout_RDX_11;
      break;
    default:
      goto switchD_004ca50a_caseD_8;
    case 9:
    case 10:
    case 0x15:
      ptr = (char *)((long)ppcVar15 + 1);
      if (ptr == end) {
        return -1;
      }
      pcVar14 = end + ~(ulong)ppcVar15;
      goto LAB_004ca97d;
    case 0xb:
      goto switchD_004ca99e_caseD_b;
    case 0x11:
      goto switchD_004ca99e_caseD_11;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_004ca6e1_caseD_16;
    case 0x17:
      if (bVar4) goto switchD_004ca50a_caseD_8;
      ptr = (char *)((long)ppcVar15 + 1);
      if (ptr == end) {
        return -1;
      }
      bVar3 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      if (bVar3 < 0x16) {
        if (bVar3 == 5) {
          if ((long)end - (long)ptr < 2) {
            return -2;
          }
          iVar6 = (**(code **)&enc[2].minBytesPerChar)(enc,ptr);
          lVar12 = 3;
          pcVar8 = extraout_RDX_12;
        }
        else if (bVar3 == 6) {
          if ((long)end - (long)ptr < 3) {
            return -2;
          }
          iVar6 = (*enc[3].scanners[0])(enc,ptr,pcVar8,(char **)0x1);
          lVar12 = 4;
          pcVar8 = extraout_RDX_13;
        }
        else {
          if (bVar3 != 7) goto switchD_004ca392_caseD_0;
          if ((long)end - (long)ptr < 4) {
            return -2;
          }
          iVar6 = (*enc[3].scanners[1])(enc,ptr,pcVar8,(char **)0x1);
          lVar12 = 5;
          pcVar8 = extraout_RDX_10;
        }
        bVar4 = true;
        if (iVar6 != 0) goto switchD_004ca6e1_caseD_16;
        goto switchD_004ca392_caseD_0;
      }
      bVar4 = true;
      lVar12 = 2;
      if ((bVar3 != 0x16) && (bVar3 != 0x18)) goto switchD_004ca392_caseD_0;
      goto switchD_004ca6e1_caseD_16;
    }
    if (iVar6 == 0) goto switchD_004ca50a_caseD_8;
switchD_004ca6e1_caseD_16:
    ppcVar15 = (char **)((long)ppcVar15 + lVar12);
    if (ppcVar15 == (char **)end) {
      return -1;
    }
    goto LAB_004ca6ba;
  case 3:
    iVar6 = normal_scanRef(enc,ptr + 1,end,nextTokPtr);
    return iVar6;
  case 4:
    pbVar1 = (byte *)(ptr + 1);
    if (pbVar1 == (byte *)end) {
      return -5;
    }
    if (*pbVar1 == 0x5d) {
      ptr = ptr + 2;
      if (ptr == end) {
        return -5;
      }
      if (*ptr == 0x3e) break;
    }
    goto joined_r0x004ca51f;
  case 5:
    puVar11 = (uint *)(end + -(long)ptr);
    if ((long)puVar11 < 2) {
      return -2;
    }
    iVar6 = (*enc[3].scanners[2])(enc,ptr,end,(char **)puVar11);
    if (iVar6 == 0) {
      pcVar8 = extraout_RDX_00;
      pbVar1 = (byte *)(ptr + 2);
      goto joined_r0x004ca51f;
    }
    break;
  case 6:
    puVar11 = (uint *)(end + -(long)ptr);
    if ((long)puVar11 < 3) {
      return -2;
    }
    iVar6 = (*enc[3].scanners[3])(enc,ptr,end,(char **)puVar11);
    if (iVar6 == 0) {
      pcVar8 = extraout_RDX;
      pbVar1 = (byte *)(ptr + 3);
      goto joined_r0x004ca51f;
    }
    break;
  case 7:
    puVar11 = (uint *)(end + -(long)ptr);
    if ((long)puVar11 < 4) {
      return -2;
    }
    iVar6 = (*enc[3].literalScanners[0])(enc,ptr,end,(char **)puVar11);
    if (iVar6 == 0) {
      pcVar8 = extraout_RDX_01;
      pbVar1 = (byte *)(ptr + 4);
      goto joined_r0x004ca51f;
    }
    break;
  case 9:
    if (ptr + 1 != end) {
      pcVar8 = ptr + 1;
      if (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[1]) == '\n') {
        pcVar8 = ptr + 2;
      }
      *nextTokPtr = pcVar8;
      return 7;
    }
    return -3;
  case 10:
    *nextTokPtr = ptr + 1;
    return 7;
  default:
    puVar11 = (uint *)nextTokPtr;
    pbVar1 = (byte *)(ptr + 1);
joined_r0x004ca51f:
    pbVar5 = pbVar1;
    if (pbVar5 == (byte *)end) {
      *nextTokPtr = (char *)pbVar5;
      return 6;
    }
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar5)) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 8:
    case 9:
    case 10:
      break;
    case 4:
      pbVar1 = pbVar5 + 1;
      if (pbVar1 == (byte *)end) break;
      if (*pbVar1 != 0x5d) goto joined_r0x004ca51f;
      puVar11 = (uint *)(pbVar5 + 2);
      if (puVar11 == (uint *)end) break;
      if (*(byte *)puVar11 == 0x3e) goto LAB_004cab74;
      goto joined_r0x004ca51f;
    case 5:
      if ((1 < (long)end - (long)pbVar5) &&
         (iVar6 = (*enc[3].scanners[2])(enc,(char *)pbVar5,pcVar8,(char **)puVar11), iVar6 == 0)) {
        pcVar8 = extraout_RDX_03;
        pbVar1 = pbVar5 + 2;
        goto joined_r0x004ca51f;
      }
      break;
    case 6:
      if ((2 < (long)end - (long)pbVar5) &&
         (iVar6 = (*enc[3].scanners[3])(enc,(char *)pbVar5,pcVar8,(char **)puVar11), iVar6 == 0)) {
        pcVar8 = extraout_RDX_02;
        pbVar1 = pbVar5 + 3;
        goto joined_r0x004ca51f;
      }
      break;
    case 7:
      if ((3 < (long)end - (long)pbVar5) &&
         (iVar6 = (*enc[3].literalScanners[0])(enc,(char *)pbVar5,pcVar8,(char **)puVar11),
         iVar6 == 0)) {
        pcVar8 = extraout_RDX_04;
        pbVar1 = pbVar5 + 4;
        goto joined_r0x004ca51f;
      }
      break;
    default:
      pbVar1 = pbVar5 + 1;
      goto joined_r0x004ca51f;
    }
    *nextTokPtr = (char *)pbVar5;
    return 6;
  }
switchD_004ca392_caseD_0:
  *nextTokPtr = ptr;
  return 0;
switchD_004caa8f_caseD_9:
  do {
    ppcVar15 = (char **)((long)ppcVar15 + 1);
    if (ppcVar15 == (char **)end) {
      return -1;
    }
    bVar3 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar15);
  } while ((bVar3 - 9 < 2) || (bVar3 == 0x15));
  if (bVar3 == 0xb) {
switchD_004caa8f_caseD_b:
    ppcVar15 = (char **)((long)ppcVar15 + 1);
    iVar6 = 5;
  }
  goto switchD_004caa8f_caseD_8;
LAB_004ca97d:
  uVar10 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  uVar9 = uVar10 - 5;
  if (uVar9 < 0x19) {
    ppcVar15 = (char **)ptr;
    switch(uVar10) {
    case 5:
      if ((long)pcVar14 < 2) {
        return -2;
      }
      iVar6 = (**(code **)&enc[2].minBytesPerChar)(enc,ptr);
      lVar12 = 3;
      break;
    case 6:
      if ((long)pcVar14 < 3) {
        return -2;
      }
      iVar6 = (*enc[3].scanners[0])
                        (enc,ptr,pcVar8,
                         (char **)((long)&switchD_004ca99e::switchdataD_005bfe84 +
                                  (long)(int)(&switchD_004ca99e::switchdataD_005bfe84)[uVar9]));
      lVar12 = 4;
      break;
    case 7:
      if ((long)pcVar14 < 4) {
        return -2;
      }
      iVar6 = (*enc[3].scanners[1])
                        (enc,ptr,pcVar8,
                         (char **)((long)&switchD_004ca99e::switchdataD_005bfe84 +
                                  (long)(int)(&switchD_004ca99e::switchdataD_005bfe84)[uVar9]));
      lVar12 = 5;
      break;
    default:
      goto switchD_004ca392_caseD_0;
    case 9:
    case 10:
    case 0x15:
      goto switchD_004ca99e_caseD_9;
    case 0xb:
switchD_004ca99e_caseD_b:
      *nextTokPtr = (char *)((long)ppcVar15 + 1);
      return 2;
    case 0x11:
switchD_004ca99e_caseD_11:
      puVar11 = (uint *)((long)ppcVar15 + 1);
      if (puVar11 == (uint *)end) {
        return -1;
      }
      if (*(byte *)puVar11 == 0x3e) {
        *nextTokPtr = (char *)((long)ppcVar15 + 2);
        return 4;
      }
LAB_004cab74:
      *nextTokPtr = (char *)puVar11;
      return 0;
    case 0x16:
    case 0x18:
      lVar12 = 2;
      goto LAB_004cac13;
    }
    if (iVar6 != 0) {
LAB_004cac13:
      iVar6 = normal_scanAtts(enc,(char *)((long)ptr + lVar12 + -1),end,nextTokPtr);
      return iVar6;
    }
  }
  goto switchD_004ca392_caseD_0;
switchD_004ca99e_caseD_9:
  ptr = (char *)((long)ptr + 1);
  pcVar14 = pcVar14 + -1;
  if (ptr == end) {
    return -1;
  }
  goto LAB_004ca97d;
}

Assistant:

static
int PREFIX(contentTok)(const ENCODING *enc, const char *ptr, const char *end,
                       const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_LT:
    return PREFIX(scanLt)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_AMP:
    return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_CR:
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_TRAILING_CR;
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_TRAILING_RSQB;
    if (!CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_TRAILING_RSQB;
    if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) { \
        *nextTokPtr = ptr; \
        return XML_TOK_DATA_CHARS; \
      } \
      ptr += n; \
      break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_RSQB:
      if (ptr + MINBPC(enc) != end) {
         if (!CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_RSQB)) {
           ptr += MINBPC(enc);
           break;
         }
         if (ptr + 2*MINBPC(enc) != end) {
           if (!CHAR_MATCHES(enc, ptr + 2*MINBPC(enc), ASCII_GT)) {
             ptr += MINBPC(enc);
             break;
           }
           *nextTokPtr = ptr + 2*MINBPC(enc);
           return XML_TOK_INVALID;
         }
      }
      /* fall through */
    case BT_AMP:
    case BT_LT:
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}